

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

vector<long,_std::allocator<long>_> *
mxx::allgather<long>
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,long *data,size_t size,
          comm *comm)

{
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<long,_std::allocator<long>_>::resize(__return_storage_ptr__,(long)comm->m_size * size)
  ;
  allgather<long>(data,size,
                  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start,comm);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> allgather(const T* data, size_t size, const mxx::comm& comm = mxx::comm()) {
    std::vector<T> result;
    result.resize(size*comm.size());
    allgather(data, size, &result[0], comm);
    return result;
}